

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O3

int newUser(string *cmd,int socket_fd)

{
  _Iter_pred<newUser(std::__cxx11::string,int)::__0> *this;
  pointer paVar1;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  ssize_t sVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  undefined8 __it;
  long lVar9;
  undefined8 uVar10;
  long local_320;
  ofstream usersFile;
  ios_base local_228 [264];
  undefined1 *local_120;
  undefined1 local_110 [8];
  undefined8 local_108;
  char *local_100;
  string password;
  vector<User,_std::allocator<User>_> users;
  long local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string username;
  long local_58;
  undefined1 local_50 [8];
  undefined8 local_48;
  undefined1 *local_40;
  int local_34;
  
  std::__cxx11::string::find((char *)cmd,0x1091e5,0);
  std::__cxx11::string::substr((ulong)(local_b8 + 0x38),(ulong)cmd);
  std::__cxx11::string::substr((ulong)&local_100,(ulong)cmd);
  std::ofstream::ofstream(&local_320,"../users.txt",_S_app);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open user.txt file",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    iVar7 = -1;
    std::ostream::flush();
    goto LAB_0010687c;
  }
  getUsers();
  paVar1 = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((username._M_dataplus._M_p < (pointer)0x20) && (password._M_dataplus._M_p + -4 < (pointer)0x5)
     ) {
    users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_88._8_8_,
               username._M_dataplus._M_p + local_88._8_8_);
    username.field_2._8_8_ = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&username.field_2 + 8),
               users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage,
               (long)&((users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)->username)._M_dataplus._M_p +
               local_c0);
    local_120 = (undefined1 *)username.field_2._8_8_;
    uVar10 = local_50;
    if ((undefined1 *)username.field_2._8_8_ == local_50) {
      local_108 = local_48;
      local_120 = local_110;
      uVar10 = username.field_2._8_8_;
    }
    username.field_2._8_8_ = uVar10;
    local_40 = local_110;
    local_50[0] = 0;
    local_a8._M_allocated_capacity = (size_type)(local_b8 + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_b8 + 0x10),local_120,local_120 + local_58);
    local_88._M_allocated_capacity = (size_type)paVar1;
    lVar9 = (long)paVar1 - password.field_2._8_8_;
    uVar10 = password.field_2._8_8_;
    local_34 = socket_fd;
    if (0 < lVar9 >> 8) {
      lVar8 = (lVar9 >> 8) + 1;
      this = (_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)(local_b8 + 0x10);
      do {
        bVar4 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          (this,(__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>
                                 )uVar10);
        __it = uVar10;
        if (bVar4) goto LAB_00106a49;
        bVar4 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          (this,(anon_struct_64_2_84df61a8 *)(uVar10 + 0x40));
        __it = (anon_struct_64_2_84df61a8 *)(uVar10 + 0x40);
        if (bVar4) goto LAB_00106a49;
        bVar4 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          (this,(anon_struct_64_2_84df61a8 *)(uVar10 + 0x80));
        __it = (anon_struct_64_2_84df61a8 *)(uVar10 + 0x80);
        if (bVar4) goto LAB_00106a49;
        bVar4 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          (this,(anon_struct_64_2_84df61a8 *)(uVar10 + 0xc0));
        __it = (anon_struct_64_2_84df61a8 *)(uVar10 + 0xc0);
        if (bVar4) goto LAB_00106a49;
        uVar10 = uVar10 + 0x100;
        lVar8 = lVar8 + -1;
        lVar9 = lVar9 + -0x100;
      } while (1 < lVar8);
    }
    uVar2 = local_88._M_allocated_capacity;
    lVar9 = lVar9 >> 6;
    if (lVar9 == 1) {
LAB_00106a34:
      bVar4 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                        ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)(local_b8 + 0x10),
                         (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                         uVar10);
      __it = uVar2;
      if (bVar4) {
        __it = uVar10;
      }
    }
    else {
      __it = uVar10;
      if (lVar9 == 2) {
LAB_00106a01:
        bVar4 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                          ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)(local_b8 + 0x10),
                           (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                           __it);
        if (!bVar4) {
          uVar10 = __it + 0x40;
          goto LAB_00106a34;
        }
      }
      else {
        __it = uVar2;
        if ((lVar9 == 3) &&
           (bVar4 = __gnu_cxx::__ops::_Iter_pred<newUser(std::__cxx11::string,int)::$_0>::operator()
                              ((_Iter_pred<newUser(std::__cxx11::string,int)::__0> *)
                               (local_b8 + 0x10),
                               (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>
                               )uVar10), __it = uVar10, !bVar4)) {
          __it = uVar10 + 0x40;
          goto LAB_00106a01;
        }
      }
    }
LAB_00106a49:
    if ((undefined1 *)local_a8._M_allocated_capacity != local_b8 + 0x20) {
      operator_delete((void *)local_a8._M_allocated_capacity);
    }
    if (local_120 != local_40) {
      operator_delete(local_120);
    }
    if ((undefined1 *)username.field_2._8_8_ != local_50) {
      operator_delete((void *)username.field_2._8_8_);
    }
    if (users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)local_b8) {
      operator_delete(users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if ((pointer)__it ==
        users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::ios::widen((char)&local_320 + (char)*(undefined8 *)(local_320 + -0x18));
      iVar7 = local_34;
      std::ostream::put((char)&local_320);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_88._8_8_,(long)username._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_100,(long)password._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      sVar5 = send(iVar7,"User successfully added!",0x1e,0);
      if (sVar5 == -1) {
        perror("send");
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"User ",5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_88._8_8_,
                          (long)username._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," successfully added",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      iVar7 = 1;
      std::ostream::flush();
    }
    else {
      sVar5 = send(local_34,"User already Exists",0x19,0);
      if (sVar5 == -1) {
        perror("send");
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"User ",5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_88._8_8_,
                          (long)username._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," already exists",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      iVar7 = -1;
      std::ostream::flush();
    }
  }
  else {
    sVar5 = send(socket_fd,"User/password not in bounds",0x1e,0);
    if (sVar5 == -1) {
      perror("send");
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"User ",5);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_88._8_8_,(long)username._M_dataplus._M_p
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"out of bounds",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    iVar7 = -2;
    std::ostream::flush();
  }
  std::vector<User,_std::allocator<User>_>::~vector
            ((vector<User,_std::allocator<User>_> *)((long)&password.field_2 + 8));
LAB_0010687c:
  local_320 = _VTT;
  *(undefined8 *)((long)&local_320 + *(long *)(_VTT + -0x18)) = _perror;
  std::filebuf::~filebuf((filebuf *)&usersFile);
  std::ios_base::~ios_base(local_228);
  if ((size_type *)local_100 != &password._M_string_length) {
    operator_delete(local_100);
  }
  if ((size_type *)local_88._8_8_ != &username._M_string_length) {
    operator_delete((void *)local_88._8_8_);
  }
  return iVar7;
}

Assistant:

int newUser(string cmd, int socket_fd){

    //parse the username and password from the command string
    size_t spacePos = cmd.find(" ");
    string username = cmd.substr(0,spacePos);
    string password = cmd.substr(spacePos+1);


    //open the user file
    ofstream usersFile("../users.txt", std::ios_base::app);

    //make sure the file is open
    if(!usersFile.is_open()){
        cerr << "Could not open user.txt file" << endl;
        return -1;
    }

    //get the list of current users
    vector<User> users = getUsers();

    //check that everything is gucci
    if(username.length() < 32 && password.length() > 3 && password.length() < 9){

        //search the currently added users
        auto it = find_if(users.begin(),users.end(),[username](User u){
            return (u.username == username);
        });

        //if it was not found, add the user
        if(it == users.end()){

            //add the new user to the file
            usersFile << endl << "(" << username << ", " << password << ")";

            //send confirmation to client that everythings good
            if(send(socket_fd,"User successfully added!", 30, 0) == -1)
                perror("send");

            //server note
            cout << "User "<< username << " successfully added" << endl;
            return 1;
        }


        //the user already exists
        if(send(socket_fd, "User already Exists",25,0) == -1)
            perror("send");
        cout << "User " << username << " already exists" << endl;
        //return the error
        return USER_EXISTS;

    }

    if(send(socket_fd, "User/password not in bounds",30,0) == -1)
            perror("send");

    cout << "User " << username << "out of bounds" << endl;
    //return the specific error code
    return UP_NOT_IN_BOUNDS;

}